

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,TPZVec<double> *par,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  TPZGeoElSideIndex *index;
  TPZGeoEl *pTVar1;
  TPZGeoMesh *mesh;
  double dVar2;
  bool bVar3;
  int iVar4;
  int a;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  TPZGeoElSide neighbyside;
  REAL Det;
  TPZFNMatrix<9,_double> Inv;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_3> NeighPar;
  TPZManVector<double,_3> DblendTemp;
  TPZManVector<double,_3> Xside;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<double,_10> parChanged;
  TPZFNMatrix<9,_double> JacTemp;
  TPZManVector<double,_10> SidesCounter;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  double local_b38;
  TPZGeoElSide local_ac8;
  REAL local_ab0;
  TPZFMatrix<double> local_aa8;
  double local_a18 [10];
  TPZManVector<int,_10> local_9c8;
  TPZManVector<double,_3> local_980;
  TPZManVector<double,_3> local_948;
  TPZManVector<double,_3> local_910;
  TPZManVector<int,_10> local_8d8;
  TPZManVector<double,_10> local_890;
  TPZFMatrix<double> local_820;
  double local_790 [10];
  TPZManVector<double,_10> local_740;
  TPZManVector<double,_3> local_6d0;
  TPZManVector<double,_3> local_698;
  TPZFMatrix<double> local_660;
  double local_5d0 [10];
  TPZFMatrix<double> local_580;
  double local_4f0 [25];
  TPZFMatrix<double> local_428;
  double local_398 [25];
  TPZFMatrix<double> local_2d0;
  double local_240 [10];
  TPZFMatrix<double> local_1f0;
  double local_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  pTVar1 = this->fGeoEl;
  TPZManVector<double,_3>::TPZManVector(&local_980,0);
  TPZManVector<double,_3>::TPZManVector(&local_698,0);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_910,3,(double *)&local_428);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_6d0,3,(double *)&local_428);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_740,3,(double *)&local_428);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_9c8);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_8d8);
  local_428.fElem = local_398;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018acc10;
  local_428.fSize = 0x18;
  local_428.fGiven = local_428.fElem;
  TPZVec<int>::TPZVec(&local_428.fPivot.super_TPZVec<int>,0);
  local_428.fPivot.super_TPZVec<int>.fStore = local_428.fPivot.fExtAlloc;
  local_428.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_428.fPivot.super_TPZVec<int>.fNElements = 0;
  local_428.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_428.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_428.fWork.fStore = (double *)0x0;
  local_428.fWork.fNElements = 0;
  local_428.fWork.fNAlloc = 0;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ac920;
  local_580.fElem = local_4f0;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018acc10;
  local_580.fSize = 0x18;
  local_580.fGiven = local_580.fElem;
  TPZVec<int>::TPZVec(&local_580.fPivot.super_TPZVec<int>,0);
  local_580.fPivot.super_TPZVec<int>.fStore = local_580.fPivot.fExtAlloc;
  local_580.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_580.fPivot.super_TPZVec<int>.fNElements = 0;
  local_580.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_580.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_580.fWork.fStore = (double *)0x0;
  local_580.fWork.fNElements = 0;
  local_580.fWork.fNAlloc = 0;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ac920;
  pztopology::TPZLine::TShape<double>(par,&local_428,&local_580);
  local_660.fElem = local_5d0;
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_660.fSize = 9;
  local_660.fGiven = local_660.fElem;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_660.fWork.fStore = (double *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_660.fElem = (double *)0x0;
  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.fElem = (double *)0x0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_2d0.fElem = local_240;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_2d0.fSize = 9;
  local_2d0.fGiven = local_2d0.fElem;
  TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
  local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
  local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2d0.fWork.fStore = (double *)0x0;
  local_2d0.fWork.fNElements = 0;
  local_2d0.fWork.fNAlloc = 0;
  local_2d0.fElem = (double *)0x0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_820.fElem = local_790;
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_820.fSize = 9;
  local_820.fGiven = local_820.fElem;
  TPZVec<int>::TPZVec(&local_820.fPivot.super_TPZVec<int>,0);
  local_820.fPivot.super_TPZVec<int>.fStore = local_820.fPivot.fExtAlloc;
  local_820.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_820.fPivot.super_TPZVec<int>.fNElements = 0;
  local_820.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_820.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_820.fWork.fStore = (double *)0x0;
  local_820.fWork.fNElements = 0;
  local_820.fWork.fNAlloc = 0;
  local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_820,0.0);
  local_1f0.fElem = local_160;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_1f0.fSize = 9;
  local_1f0.fGiven = local_1f0.fElem;
  TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
  local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
  local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1f0.fWork.fStore = (double *)0x0;
  local_1f0.fWork.fNElements = 0;
  local_1f0.fWork.fNAlloc = 0;
  local_1f0.fElem = (double *)0x0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  mesh = pTVar1->fMesh;
  index = this->fNeighbours;
  TPZGeoElSide::TPZGeoElSide(&local_ac8,index,mesh);
  if ((local_ac8.fGeoEl != (TPZGeoEl *)0x0) && (-1 < local_ac8.fSide)) {
    pztopology::TPZLine::LowerDimensionSides(2,(TPZStack<int,_10> *)&local_9c8,0);
    pztopology::TPZLine::LowerDimensionSides(2,(TPZStack<int,_10> *)&local_8d8);
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_aa8,index,mesh);
    iVar4 = TPZGeoElSide::Dimension((TPZGeoElSide *)&local_aa8);
    lVar5 = (long)iVar4;
    local_aa8.fElem = local_a18;
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183dbe0;
    local_aa8.fSize = 9;
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar5;
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar5;
    local_aa8.fGiven = local_aa8.fElem;
    TPZVec<int>::TPZVec(&local_aa8.fPivot.super_TPZVec<int>,0);
    local_aa8.fPivot.super_TPZVec<int>.fStore = local_aa8.fPivot.fExtAlloc;
    local_aa8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_aa8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_aa8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_aa8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_aa8.fWork.fStore = (double *)0x0;
    local_aa8.fWork.fNElements = 0;
    local_aa8.fWork.fNAlloc = 0;
    if (iVar4 == 0) {
      local_aa8.fElem = (double *)0x0;
    }
    else {
      uVar6 = lVar5 * lVar5;
      if (9 < uVar6) {
        local_aa8.fElem = (double *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
      }
    }
    local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
    iVar4 = TPZGeoElSide::Dimension(&local_ac8);
    bVar3 = MapToNeighSide<double>(this,2,iVar4,par,&local_980.super_TPZVec<double>,&local_1f0);
    if (bVar3) {
      TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_890,index,mesh);
      TPZGeoElSide::X((TPZGeoElSide *)&local_890,&local_980.super_TPZVec<double>,
                      &local_910.super_TPZVec<double>);
      TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_890,index,mesh);
      TPZGeoElSide::Jacobian
                ((TPZGeoElSide *)&local_890,&local_980.super_TPZVec<double>,&local_660,&local_2d0,
                 &local_ab0,&local_aa8);
      TPZFMatrix<double>::Transpose(&local_2d0);
      TPZMatrix<double>::Multiply(&local_2d0.super_TPZMatrix<double>,&local_660,&local_110,0);
      TPZMatrix<double>::Multiply(&local_110.super_TPZMatrix<double>,&local_1f0,&local_660,0);
      local_890.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&local_948,1,(double *)&local_890);
      if (local_9c8.super_TPZVec<int>.fNElements < 1) {
        local_b38 = 0.0;
      }
      else {
        local_b38 = 0.0;
        lVar5 = 0;
        do {
          TPZManVector<double,_10>::TPZManVector(&local_890,par->fNElements);
          pztopology::TPZLine::TShape<double>(&local_890.super_TPZVec<double>,&local_428,&local_580)
          ;
          lVar7 = (long)local_9c8.super_TPZVec<int>.fStore[lVar5];
          if (((lVar7 < 0) || (local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7))
             || (local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_b38 = local_b38 + local_428.fElem[lVar7];
          iVar4 = local_9c8.super_TPZVec<int>.fStore[lVar5];
          if (((local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (iVar4 < 0)) ||
             (local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= iVar4)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *local_948.super_TPZVec<double>.fStore =
               local_580.fElem[iVar4 * local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] +
               *local_948.super_TPZVec<double>.fStore;
          TPZManVector<double,_10>::~TPZManVector(&local_890);
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_9c8.super_TPZVec<int>.fNElements);
      }
      lVar5 = 0;
      do {
        if ((local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_820.fElem[lVar5] =
             (1.0 - local_740.super_TPZVec<double>.fStore[2]) *
             (local_660.fElem[lVar5] * local_b38 +
             local_910.super_TPZVec<double>.fStore[lVar5] * *local_948.super_TPZVec<double>.fStore)
             + local_820.fElem[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      if (0 < local_8d8.super_TPZVec<int>.fNElements) {
        lVar5 = 0;
        do {
          local_740.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar5]] =
               (1.0 - local_740.super_TPZVec<double>.fStore[2]) +
               local_740.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar5]];
          lVar5 = lVar5 + 1;
        } while (local_8d8.super_TPZVec<int>.fNElements != lVar5);
      }
      TPZManVector<double,_3>::~TPZManVector(&local_948);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_aa8,&PTR_PTR_0183dba8);
  }
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar8 = 0;
    do {
      if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
         ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
         (local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_820.fElem[lVar8] =
           (1.0 - local_740.super_TPZVec<double>.fStore[lVar5]) *
           *(double *)
            ((long)coord->fElem +
            lVar8 * 8 + (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7) *
           local_580.fElem[local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5] +
           local_820.fElem[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 8;
    bVar3 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar3);
  local_aa8.fElem = local_a18;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_aa8.fSize = 9;
  local_aa8.fGiven = local_aa8.fElem;
  TPZVec<int>::TPZVec(&local_aa8.fPivot.super_TPZVec<int>,0);
  local_aa8.fPivot.super_TPZVec<int>.fStore = local_aa8.fPivot.fExtAlloc;
  local_aa8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_aa8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_aa8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_aa8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_aa8.fWork.fStore = (double *)0x0;
  local_aa8.fWork.fNElements = 0;
  local_aa8.fWork.fNAlloc = 0;
  local_aa8.fElem = (double *)0x0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::GramSchmidt(&local_820,&local_aa8,jacobian);
  TPZFMatrix<double>::Transpose(&local_aa8,&axes->super_TPZMatrix<double>);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
             (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  uVar6 = -(ulong)(ABS(*jacobian->fElem) < 1e-12);
  dVar2 = (double)(~uVar6 & (ulong)*jacobian->fElem | uVar6 & 0x3d719799812dea11);
  *detjac = dVar2;
  if ((0 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (0 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    *jacinv->fElem = 1.0 / dVar2;
    TPZFMatrix<double>::~TPZFMatrix(&local_aa8,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_820,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_2d0,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_660,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_580,&PTR_PTR_018acbd8);
    TPZFMatrix<double>::~TPZFMatrix(&local_428,&PTR_PTR_018acbd8);
    TPZManVector<int,_10>::~TPZManVector(&local_8d8);
    TPZManVector<int,_10>::~TPZManVector(&local_9c8);
    TPZManVector<double,_10>::~TPZManVector(&local_740);
    TPZManVector<double,_3>::~TPZManVector(&local_6d0);
    TPZManVector<double,_3>::~TPZManVector(&local_910);
    TPZManVector<double,_3>::~TPZManVector(&local_698);
    TPZManVector<double,_3>::~TPZManVector(&local_980);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}